

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

CURLcode http2_send_ping(Curl_cfilter *cf,Curl_easy *data)

{
  undefined8 *puVar1;
  uint uVar2;
  char *pcVar3;
  int rc;
  cf_h2_ctx *ctx;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  puVar1 = (undefined8 *)cf->ctx;
  uVar2 = nghttp2_submit_ping((nghttp2_session *)*puVar1,'\0',(uint8_t *)0x0);
  if (uVar2 == 0) {
    uVar2 = nghttp2_session_send((nghttp2_session *)*puVar1);
    if (uVar2 == 0) {
      cf_local._4_4_ = CURLE_OK;
    }
    else {
      pcVar3 = nghttp2_strerror(uVar2);
      Curl_failf(data,"nghttp2_session_send() failed: %s(%d)",pcVar3,(ulong)uVar2);
      cf_local._4_4_ = CURLE_SEND_ERROR;
    }
  }
  else {
    pcVar3 = nghttp2_strerror(uVar2);
    Curl_failf(data,"nghttp2_submit_ping() failed: %s(%d)",pcVar3,(ulong)uVar2);
    cf_local._4_4_ = CURLE_HTTP2;
  }
  return cf_local._4_4_;
}

Assistant:

static CURLcode http2_send_ping(struct Curl_cfilter *cf,
                                struct Curl_easy *data)
{
  struct cf_h2_ctx *ctx = cf->ctx;
  int rc;

  rc = nghttp2_submit_ping(ctx->h2, 0, ZERO_NULL);
  if(rc) {
    failf(data, "nghttp2_submit_ping() failed: %s(%d)",
          nghttp2_strerror(rc), rc);
   return CURLE_HTTP2;
  }

  rc = nghttp2_session_send(ctx->h2);
  if(rc) {
    failf(data, "nghttp2_session_send() failed: %s(%d)",
          nghttp2_strerror(rc), rc);
    return CURLE_SEND_ERROR;
  }
  return CURLE_OK;
}